

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprIterate2(Fts3Expr *pExpr,int *piPhrase,_func_int_Fts3Expr_ptr_int_void_ptr *x,void *pCtx
                    )

{
  int iVar1;
  int local_2c;
  int eType;
  int rc;
  void *pCtx_local;
  _func_int_Fts3Expr_ptr_int_void_ptr *x_local;
  int *piPhrase_local;
  Fts3Expr *pExpr_local;
  
  iVar1 = pExpr->eType;
  if (iVar1 == 5) {
    local_2c = (*x)(pExpr,*piPhrase,pCtx);
    *piPhrase = *piPhrase + 1;
  }
  else {
    local_2c = fts3ExprIterate2(pExpr->pLeft,piPhrase,x,pCtx);
    if ((local_2c == 0) && (iVar1 != 2)) {
      local_2c = fts3ExprIterate2(pExpr->pRight,piPhrase,x,pCtx);
    }
  }
  return local_2c;
}

Assistant:

static int fts3ExprIterate2(
  Fts3Expr *pExpr,                /* Expression to iterate phrases of */
  int *piPhrase,                  /* Pointer to phrase counter */
  int (*x)(Fts3Expr*,int,void*),  /* Callback function to invoke for phrases */
  void *pCtx                      /* Second argument to pass to callback */
){
  int rc;                         /* Return code */
  int eType = pExpr->eType;     /* Type of expression node pExpr */

  if( eType!=FTSQUERY_PHRASE ){
    assert( pExpr->pLeft && pExpr->pRight );
    rc = fts3ExprIterate2(pExpr->pLeft, piPhrase, x, pCtx);
    if( rc==SQLITE_OK && eType!=FTSQUERY_NOT ){
      rc = fts3ExprIterate2(pExpr->pRight, piPhrase, x, pCtx);
    }
  }else{
    rc = x(pExpr, *piPhrase, pCtx);
    (*piPhrase)++;
  }
  return rc;
}